

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O1

void helper_set_dr_x86_64(CPUX86State *env,int reg,target_ulong t0)

{
  byte bVar1;
  uintptr_t unaff_retaddr;
  
  switch(reg) {
  case 0:
  case 1:
  case 2:
  case 3:
    bVar1 = (char)reg * '\x02';
    if (((env->dr[7] & (1L << (bVar1 & 0x3f) | 2L << (bVar1 & 0x3f))) != 0) &&
       (((uint)(env->dr[7] >> ((char)reg * '\x04' + 0x10U & 0x3f)) & 3) != 2)) {
      hw_breakpoint_remove(env,reg);
      env->dr[reg] = t0;
      hw_breakpoint_insert(env,reg);
      return;
    }
    env->dr[reg] = t0;
    break;
  case 4:
    if ((env->cr[4] & 8) != 0) goto switchD_0050a955_default;
  case 6:
    env->dr[6] = t0 | 0xffff0ff0;
    break;
  case 5:
    if ((env->cr[4] & 8) == 0) goto switchD_0050a955_caseD_7;
  default:
switchD_0050a955_default:
    raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
  case 7:
switchD_0050a955_caseD_7:
    cpu_x86_update_dr7_x86_64(env,(uint32_t)t0);
    return;
  }
  return;
}

Assistant:

void helper_set_dr(CPUX86State *env, int reg, target_ulong t0)
{
    switch (reg) {
    case 0: case 1: case 2: case 3:
        if (hw_breakpoint_enabled(env->dr[7], reg)
            && hw_breakpoint_type(env->dr[7], reg) != DR7_TYPE_IO_RW) {
            hw_breakpoint_remove(env, reg);
            env->dr[reg] = t0;
            hw_breakpoint_insert(env, reg);
        } else {
            env->dr[reg] = t0;
        }
        return;
    case 4:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        }
        /* fallthru */
    case 6:
        env->dr[6] = t0 | DR6_FIXED_1;
        return;
    case 5:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        }
        /* fallthru */
    case 7:
        cpu_x86_update_dr7(env, t0);
        return;
    }
    raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
}